

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void free_old_nodes(Parser *p)

{
  uint32 *puVar1;
  PNode *pPVar2;
  SNode *pSVar3;
  PNode *pPVar4;
  SNode **ppSVar5;
  PNode **ppPVar6;
  SNode **ppSVar7;
  PNode **ppPVar8;
  SNode *pSVar9;
  SNode *pSVar10;
  PNode *pn;
  ulong uVar11;
  
  pPVar2 = (p->pnode_hash).all;
  pSVar9 = (p->snode_hash).all;
  while (pSVar9 != (SNode *)0x0) {
    pSVar10 = pSVar9->all_next;
    ppSVar5 = (p->snode_hash).v +
              (ulong)(uint)((int)(((long)pSVar9->state - (long)p->t->state) / 0x78) * 0x1000 +
                           *(int *)&pSVar9->initial_scope) % (ulong)(p->snode_hash).m;
    do {
      ppSVar7 = ppSVar5;
      pSVar3 = *ppSVar7;
      ppSVar5 = &pSVar3->bucket_next;
    } while (pSVar3 != pSVar9);
    *ppSVar7 = *ppSVar5;
    pSVar9 = pSVar10;
  }
  pSVar9 = (p->snode_hash).last_all;
  (p->snode_hash).last_all = (SNode *)0x0;
  while (pSVar10 = pSVar9, pSVar10 != (SNode *)0x0) {
    pSVar9 = pSVar10->all_next;
    puVar1 = &pSVar10->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_SNode(p,pSVar10);
    }
  }
  (p->snode_hash).last_all = (p->snode_hash).all;
  (p->snode_hash).all = (SNode *)0x0;
  while (pn = pPVar2, pn != (PNode *)0x0) {
    for (uVar11 = 0; uVar11 < (pn->children).n; uVar11 = uVar11 + 1) {
      while( true ) {
        ppPVar6 = (pn->children).v;
        pPVar2 = ppPVar6[uVar11];
        pPVar4 = pPVar2->latest;
        if (pPVar2 == pPVar4) break;
        pPVar4->refcount = pPVar4->refcount + 1;
        puVar1 = &pPVar2->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pPVar2);
          ppPVar6 = (pn->children).v;
        }
        ppPVar6[uVar11] = pPVar4;
      }
    }
    pPVar2 = pn->all_next;
    ppPVar6 = (p->pnode_hash).v +
              (ulong)(uint)(*(int *)&(pn->parse_node).end_skip * 0x10000 +
                            *(int *)&(pn->parse_node).start_loc.s * 0x100 + (pn->parse_node).symbol
                           + *(int *)&pn->initial_scope) % (ulong)(p->pnode_hash).m;
    do {
      ppPVar8 = ppPVar6;
      pPVar4 = *ppPVar8;
      ppPVar6 = &pPVar4->bucket_next;
    } while (pPVar4 != pn);
    *ppPVar8 = *ppPVar6;
    puVar1 = &pn->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn);
    }
  }
  (p->pnode_hash).n = 0;
  (p->pnode_hash).all = (PNode *)0x0;
  return;
}

Assistant:

static void free_old_nodes(Parser *p) {
  uint i, h;
  PNode *pn = p->pnode_hash.all, *tpn, **lpn;
  SNode *sn = p->snode_hash.all, *tsn, **lsn;
  while (sn) {
    h = SNODE_HASH(sn->state - p->t->state, sn->initial_scope);
    lsn = &p->snode_hash.v[h % p->snode_hash.m];
    tsn = sn;
    sn = sn->all_next;
    while (*lsn != tsn) lsn = &(*lsn)->bucket_next;
    *lsn = (*lsn)->bucket_next;
  }
  sn = p->snode_hash.last_all;
  p->snode_hash.last_all = 0;
  while (sn) {
    tsn = sn;
    sn = sn->all_next;
    unref_sn(p, tsn);
  }
  p->snode_hash.last_all = p->snode_hash.all;
  p->snode_hash.all = NULL;
  while (pn) {
    for (i = 0; i < pn->children.n; i++) {
      while (pn->children.v[i] != pn->children.v[i]->latest) {
        tpn = pn->children.v[i]->latest;
        ref_pn(tpn);
        unref_pn(p, pn->children.v[i]);
        pn->children.v[i] = tpn;
      }
    }
    h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope);
    lpn = &p->pnode_hash.v[h % p->pnode_hash.m];
    tpn = pn;
    pn = pn->all_next;
    while (*lpn != tpn) lpn = &(*lpn)->bucket_next;
    *lpn = (*lpn)->bucket_next;
    unref_pn(p, tpn);
  }
  p->pnode_hash.n = 0;
  p->pnode_hash.all = NULL;
}